

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

xmlChar * xmlTextReaderConstValue(xmlTextReaderPtr reader)

{
  xmlElementType xVar1;
  _xmlNode *p_Var2;
  xmlGenericErrorFunc p_Var3;
  xmlChar *pxVar4;
  xmlBufPtr pxVar5;
  xmlGenericErrorFunc *pp_Var6;
  void **ppvVar7;
  xmlAttrPtr attr;
  xmlNodePtr cur;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->node == (xmlNodePtr)0x0)) {
    pxVar4 = (xmlChar *)0x0;
  }
  else {
    cur = reader->node;
    if (reader->curnode != (xmlNodePtr)0x0) {
      cur = reader->curnode;
    }
    xVar1 = cur->type;
    pxVar4 = (xmlChar *)0x0;
    if (xVar1 < XML_XINCLUDE_START) {
      if ((0x198U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
        if (xVar1 == XML_ATTRIBUTE_NODE) {
          p_Var2 = cur->children;
          if (((p_Var2 == (_xmlNode *)0x0) || (p_Var2->type != XML_TEXT_NODE)) ||
             (p_Var2->next != (_xmlNode *)0x0)) {
            if (reader->buffer == (xmlBufPtr)0x0) {
              pxVar5 = xmlBufCreateSize(100);
              reader->buffer = pxVar5;
              if (pxVar5 == (xmlBufPtr)0x0) {
                pp_Var6 = __xmlGenericError();
                p_Var3 = *pp_Var6;
                ppvVar7 = __xmlGenericErrorContext();
                (*p_Var3)(*ppvVar7,"xmlTextReaderSetup : malloc failed\n");
                return (xmlChar *)0x0;
              }
              xmlBufSetAllocationScheme(pxVar5,XML_BUFFER_ALLOC_BOUNDED);
            }
            else {
              xmlBufEmpty(reader->buffer);
            }
            xmlBufGetNodeContent(reader->buffer,cur);
            pxVar4 = xmlBufContent(reader->buffer);
            if (pxVar4 == (xmlChar *)0x0) {
              xmlBufFree(reader->buffer);
              pxVar5 = xmlBufCreateSize(100);
              reader->buffer = pxVar5;
              xmlBufSetAllocationScheme(pxVar5,XML_BUFFER_ALLOC_BOUNDED);
              pxVar4 = "";
            }
          }
          else {
            pxVar4 = p_Var2->content;
          }
        }
        else if (xVar1 == XML_NAMESPACE_DECL) {
          pxVar4 = cur->name;
        }
      }
      else {
        pxVar4 = cur->content;
      }
    }
  }
  return pxVar4;
}

Assistant:

const xmlChar *
xmlTextReaderConstValue(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    if (reader == NULL)
	return(NULL);
    if (reader->node == NULL)
	return(NULL);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;

    switch (node->type) {
        case XML_NAMESPACE_DECL:
	    return(((xmlNsPtr) node)->href);
        case XML_ATTRIBUTE_NODE:{
	    xmlAttrPtr attr = (xmlAttrPtr) node;
	    const xmlChar *ret;

	    if ((attr->children != NULL) &&
	        (attr->children->type == XML_TEXT_NODE) &&
		(attr->children->next == NULL))
		return(attr->children->content);
	    else {
		if (reader->buffer == NULL) {
		    reader->buffer = xmlBufCreateSize(100);
                    if (reader->buffer == NULL) {
                        xmlGenericError(xmlGenericErrorContext,
                                        "xmlTextReaderSetup : malloc failed\n");
                        return (NULL);
                    }
		    xmlBufSetAllocationScheme(reader->buffer,
		                              XML_BUFFER_ALLOC_BOUNDED);
                } else
                    xmlBufEmpty(reader->buffer);
	        xmlBufGetNodeContent(reader->buffer, node);
		ret = xmlBufContent(reader->buffer);
		if (ret == NULL) {
		    /* error on the buffer best to reallocate */
		    xmlBufFree(reader->buffer);
		    reader->buffer = xmlBufCreateSize(100);
		    xmlBufSetAllocationScheme(reader->buffer,
		                              XML_BUFFER_ALLOC_BOUNDED);
		    ret = BAD_CAST "";
		}
		return(ret);
	    }
	    break;
	}
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
	    return(node->content);
	default:
	    break;
    }
    return(NULL);
}